

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

void fnode_service_update(fnode_service_t *svc)

{
  fnode_service_state_t fVar1;
  fnode_service_t *in_RDI;
  fnode_service_t *unaff_retaddr;
  fnode_service_t *in_stack_00000020;
  
  if (in_RDI != (fnode_service_t *)0x0) {
    fVar1 = in_RDI->state;
    if (fVar1 == FSVC_INIT) {
      fVar1 = fnode_service_init_handler(in_RDI);
      in_RDI->state = fVar1;
    }
    else if (fVar1 == FSVC_PROCESS_COMMANDS) {
      fVar1 = fnode_service_process_commands(in_stack_00000020);
      in_RDI->state = fVar1;
    }
    else if (fVar1 == FSVC_NOTIFY_STATUS) {
      fVar1 = fnode_service_notify_status(unaff_retaddr);
      in_RDI->state = fVar1;
    }
  }
  return;
}

Assistant:

void fnode_service_update(fnode_service_t *svc)
{
    if (!svc)
        return;

    switch(svc->state)
    {
        case FSVC_INIT:
        {
            svc->state = fnode_service_init_handler(svc);
            break;
        }

        case FSVC_NOTIFY_STATUS:
        {
            svc->state = fnode_service_notify_status(svc);
            break;
        }

        case FSVC_PROCESS_COMMANDS:
        {
            svc->state = fnode_service_process_commands(svc);
            break;
        }
    }
}